

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O1

void __thiscall xe::TcpIpRecvThread::run(TcpIpRecvThread *this)

{
  ulong uVar1;
  size_t sVar2;
  deSocketResult dVar3;
  Error *this_00;
  deUint8 *data;
  ulong __new_size;
  MessageType messageType;
  size_t messageSize;
  size_t numRecv;
  MessageType local_44;
  size_t local_40;
  size_t local_38;
  
LAB_00123ba2:
  do {
    uVar1 = this->m_curMsgPos;
    local_40 = 0;
    local_44 = MESSAGETYPE_NONE;
    if (7 < uVar1) {
      xs::Message::parseHeader
                ((this->m_curMsgBuf).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,8,&local_44,&local_40);
      if (local_40 <= this->m_curMsgPos) {
        data = (this->m_curMsgBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_start + 8;
        if (this->m_curMsgPos < 9) {
          data = (deUint8 *)0x0;
        }
        handleMessage(this,local_44,data,local_40 - 8);
        this->m_curMsgPos = 0;
        goto LAB_00123ba2;
      }
    }
    __new_size = 8;
    if (7 < uVar1) {
      __new_size = local_40;
    }
    sVar2 = this->m_curMsgPos;
    local_38 = 0;
    if ((ulong)((long)(this->m_curMsgBuf).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_curMsgBuf).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) < __new_size) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->m_curMsgBuf,__new_size);
    }
    dVar3 = deSocket_receive(this->m_socket->m_socket,
                             (this->m_curMsgBuf).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start + this->m_curMsgPos,
                             __new_size - sVar2,&local_38);
    switch(dVar3) {
    case DE_SOCKETRESULT_WOULD_BLOCK:
      deYield();
      break;
    case DE_SOCKETRESULT_CONNECTION_CLOSED:
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,"Connection closed","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x143);
LAB_00123d1e:
      __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
    case DE_SOCKETRESULT_CONNECTION_TERMINATED:
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,"Connection terminated","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x145);
      goto LAB_00123d1e;
    case DE_SOCKETRESULT_ERROR:
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,"Socket error","",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTcpIpLink.cpp"
                   ,0x147);
      goto LAB_00123d1e;
    default:
      this->m_curMsgPos = this->m_curMsgPos + local_38;
    }
  } while( true );
}

Assistant:

void TcpIpRecvThread::run (void)
{
	try
	{
		for (;;)
		{
			bool				hasHeader		= m_curMsgPos >= xs::MESSAGE_HEADER_SIZE;
			bool				hasPayload		= false;
			size_t				messageSize		= 0;
			xs::MessageType		messageType		= (xs::MessageType)0;

			if (hasHeader)
			{
				xs::Message::parseHeader(&m_curMsgBuf[0], xs::MESSAGE_HEADER_SIZE, messageType, messageSize);
				hasPayload = m_curMsgPos >= messageSize;
			}

			if (hasPayload)
			{
				// Process message.
				handleMessage(messageType, m_curMsgPos > xs::MESSAGE_HEADER_SIZE ? &m_curMsgBuf[xs::MESSAGE_HEADER_SIZE] : DE_NULL, messageSize-xs::MESSAGE_HEADER_SIZE);
				m_curMsgPos = 0;
			}
			else
			{
				// Try to receive missing bytes.
				size_t				curSize			= hasHeader ? messageSize : (size_t)xs::MESSAGE_HEADER_SIZE;
				size_t				bytesToRecv		= curSize-m_curMsgPos;
				size_t				numRecv			= 0;
				deSocketResult		result			= DE_SOCKETRESULT_LAST;

				if (m_curMsgBuf.size() < curSize)
					m_curMsgBuf.resize(curSize);

				result = m_socket.receive(&m_curMsgBuf[m_curMsgPos], bytesToRecv, &numRecv);

				if (result == DE_SOCKETRESULT_CONNECTION_CLOSED)
					XE_FAIL("Connection closed");
				else if (result == DE_SOCKETRESULT_CONNECTION_TERMINATED)
					XE_FAIL("Connection terminated");
				else if (result == DE_SOCKETRESULT_ERROR)
					XE_FAIL("Socket error");
				else if (result == DE_SOCKETRESULT_WOULD_BLOCK)
				{
					// \note Socket should not be in non-blocking mode.
					DE_ASSERT(numRecv == 0);
					deYield();
				}
				else
				{
					DE_ASSERT(result == DE_SOCKETRESULT_SUCCESS);
					DE_ASSERT(numRecv <= bytesToRecv);
					m_curMsgPos += numRecv;
					// Continue receiving bytes / handle message in next iter.
				}
			}
		}
	}
	catch (const std::exception& e)
	{
		m_state.setState(COMMLINKSTATE_ERROR, e.what());
	}
}